

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
kj::Vector<kj::StringPtr>::addAll<kj::StringPtr_const*>
          (Vector<kj::StringPtr> *this,StringPtr *begin,StringPtr *end)

{
  size_t sVar1;
  ulong minCapacity;
  size_t needed;
  StringPtr *end_local;
  StringPtr *begin_local;
  Vector<kj::StringPtr> *this_local;
  
  sVar1 = ArrayBuilder<kj::StringPtr>::size(&this->builder);
  minCapacity = sVar1 + ((long)end - (long)begin >> 4);
  sVar1 = ArrayBuilder<kj::StringPtr>::capacity(&this->builder);
  if (sVar1 < minCapacity) {
    grow(this,minCapacity);
  }
  ArrayBuilder<kj::StringPtr>::addAll<kj::StringPtr_const*,false>(&this->builder,begin,end);
  return;
}

Assistant:

inline void addAll(Iterator begin, Iterator end) {
    size_t needed = builder.size() + (end - begin);
    if (needed > builder.capacity()) grow(needed);
    builder.addAll(begin, end);
  }